

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

optional<double> slang::parseDouble(string_view name,string_view value,string *error)

{
  string_view str;
  bool bVar1;
  undefined1 uVar2;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 extraout_RAX_00;
  undefined8 uVar4;
  char *in_RCX;
  size_t in_RDX;
  optional<double> oVar5;
  optional<double> val;
  size_t pos;
  undefined1 in_stack_000000c0 [16];
  undefined1 in_stack_000000d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  char *x;
  value<fmt::v11::context> *in_stack_fffffffffffffe70;
  value<fmt::v11::context> *this;
  undefined1 local_188 [32];
  size_t local_168;
  char *local_160;
  _Storage<double,_true> local_158;
  undefined1 in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [16];
  _Storage<double,_true> local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  char *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_108._M_len = in_RDX;
  local_108._M_str = in_RCX;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_108);
  if (bVar1) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
    local_90 = &stack0xfffffffffffffed0;
    local_a0 = "expected value for argument \'{}\'";
    local_98 = 0x20;
    local_a8 = local_f8;
    local_b8 = "expected value for argument \'{}\'";
    local_b0 = 0x20;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_8 = &local_c8;
    local_10 = local_d8;
    local_c8 = 0xd;
    local_c0 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000d0,(format_args)in_stack_000000c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffed0,pbVar3);
    std::__cxx11::string::~string(in_stack_fffffffffffffe60);
    std::optional<double>::optional((optional<double> *)0x2aeed4);
    uVar4 = extraout_RAX;
  }
  else {
    local_168 = local_108._M_len;
    local_160 = local_108._M_str;
    str._M_str = in_stack_fffffffffffffec0;
    str._M_len = (size_t)in_stack_fffffffffffffeb8;
    oVar5 = strToDouble(str,(size_t *)CONCAT71(in_stack_fffffffffffffeb1,in_stack_fffffffffffffeb0))
    ;
    local_158 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
    uVar2 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional<double> *)0x2aef1b);
    if ((bVar1) &&
       (pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::basic_string_view<char,_std::char_traits<char>_>::size(&local_108),
       in_stack_fffffffffffffe60 = in_stack_fffffffffffffeb8, in_stack_fffffffffffffeb8 == pbVar3))
    {
      local_e8 = local_158;
      uVar4 = CONCAT71(in_stack_fffffffffffffeb1,uVar2);
      local_e0 = uVar4;
    }
    else {
      x = "invalid value \'{}\' for float argument \'{}\'";
      this = (value<fmt::v11::context> *)0x2a;
      local_28 = local_188;
      local_38 = "invalid value \'{}\' for float argument \'{}\'";
      local_30 = 0x2a;
      local_40 = &local_108;
      local_48 = local_f8;
      local_58 = "invalid value \'{}\' for float argument \'{}\'";
      local_50 = 0x2a;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)0x2a,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 "invalid value \'{}\' for float argument \'{}\'");
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (this,(basic_string_view<char,_std::char_traits<char>_> *)x);
      local_18 = &local_68;
      local_20 = local_88;
      local_68 = 0xdd;
      local_60 = local_20;
      ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000d0,(format_args)in_stack_000000c0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(in_stack_fffffffffffffe60);
      std::optional<double>::optional((optional<double> *)0x2af081);
      uVar4 = extraout_RAX_00;
    }
  }
  oVar5.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)(undefined1)local_e0;
  oVar5.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = local_e8;
  return (optional<double>)
         oVar5.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

static std::optional<double> parseDouble(std::string_view name, std::string_view value,
                                         std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    size_t pos;
    std::optional<double> val = strToDouble(value, &pos);
    if (!val || pos != value.size()) {
        error = fmt::format("invalid value '{}' for float argument '{}'", value, name);
        return {};
    }

    return val;
}